

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O2

void __thiscall cmCPackIFWPackage::GeneratePackageFile(cmCPackIFWPackage *this)

{
  string *__lhs;
  _Rb_tree_header *p_Var1;
  cmCPackIFWGenerator *pcVar2;
  _Base_ptr p_Var3;
  ostream *poVar4;
  long lVar5;
  size_t i;
  size_t i_2;
  ulong uVar6;
  string path_3;
  set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  compAutoDepSet;
  set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  compDepSet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  licenses;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  userInterfaces;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  translations;
  cmXMLWriter xout;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  cmGeneratedFileStream fout;
  
  __lhs = &this->Directory;
  if ((this->Directory)._M_string_length == 0) {
    if (this->Installer == (cmCPackIFWInstaller *)0x0) {
      pcVar2 = (this->super_cmCPackIFWCommon).Generator;
      if (pcVar2 == (cmCPackIFWGenerator *)0x0) goto LAB_002db3c8;
      std::operator+(&name,&(pcVar2->super_cmCPackGenerator).toplevel,"/packages/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                     &name,&this->Name);
    }
    else {
      std::operator+(&name,&this->Installer->Directory,"/packages/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                     &name,&this->Name);
    }
    std::__cxx11::string::operator=((string *)__lhs,(string *)&fout);
    std::__cxx11::string::~string((string *)&fout);
    std::__cxx11::string::~string((string *)&name);
  }
LAB_002db3c8:
  std::operator+(&name,__lhs,"/meta/package.xml");
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,name._M_dataplus._M_p,false,None);
  std::__cxx11::string::~string((string *)&name);
  cmXMLWriter::cmXMLWriter(&xout,(ostream *)&fout,0);
  cmXMLWriter::StartDocument(&xout,"UTF-8");
  cmCPackIFWCommon::WriteGeneratedByToStrim(&this->super_cmCPackIFWCommon,&xout);
  std::__cxx11::string::string((string *)&name,"Package",(allocator *)&compDepSet);
  cmXMLWriter::StartElement(&xout,&name);
  std::__cxx11::string::~string((string *)&name);
  for (p_Var3 = (this->DisplayName)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->DisplayName)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::__cxx11::string::string((string *)&name,"DisplayName",(allocator *)&compDepSet);
    cmXMLWriter::StartElement(&xout,&name);
    std::__cxx11::string::~string((string *)&name);
    if (p_Var3[1]._M_parent != (_Base_ptr)0x0) {
      cmXMLWriter::Attribute<std::__cxx11::string>
                (&xout,"xml:lang",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1));
    }
    cmXMLWriter::Content<std::__cxx11::string>
              (&xout,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var3 + 2));
    cmXMLWriter::EndElement(&xout);
  }
  for (p_Var3 = (this->Description)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->Description)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::__cxx11::string::string((string *)&name,"Description",(allocator *)&compDepSet);
    cmXMLWriter::StartElement(&xout,&name);
    std::__cxx11::string::~string((string *)&name);
    if (p_Var3[1]._M_parent != (_Base_ptr)0x0) {
      cmXMLWriter::Attribute<std::__cxx11::string>
                (&xout,"xml:lang",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1));
    }
    cmXMLWriter::Content<std::__cxx11::string>
              (&xout,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var3 + 2));
    cmXMLWriter::EndElement(&xout);
  }
  if ((this->UpdateText)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&name,"UpdateText",(allocator *)&compDepSet);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->UpdateText);
    std::__cxx11::string::~string((string *)&name);
  }
  std::__cxx11::string::string((string *)&name,"Name",(allocator *)&compDepSet);
  cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->Name);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string((string *)&name,"Version",(allocator *)&compDepSet);
  cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->Version);
  std::__cxx11::string::~string((string *)&name);
  if ((this->ReleaseDate)._M_string_length == 0) {
    std::__cxx11::string::string((string *)&name,"ReleaseDate",(allocator *)&path_3);
    std::__cxx11::string::string((string *)&compAutoDepSet,"%Y-%m-%d",(allocator *)&userInterfaces);
    cmTimestamp::CurrentTime
              ((string *)&compDepSet,(cmTimestamp *)&local_298,(string *)&compAutoDepSet,true);
    cmXMLWriter::Element<std::__cxx11::string>
              (&xout,&name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&compDepSet);
    std::__cxx11::string::~string((string *)&compDepSet);
    std::__cxx11::string::~string((string *)&compAutoDepSet);
  }
  else {
    std::__cxx11::string::string((string *)&name,"ReleaseDate",(allocator *)&compDepSet);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->ReleaseDate);
  }
  std::__cxx11::string::~string((string *)&name);
  if ((this->Script)._M_string_length != 0) {
    cmsys::SystemTools::GetFilenameName(&name,&this->Script);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &compAutoDepSet,__lhs,"/meta/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&compDepSet,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &compAutoDepSet,&name);
    std::__cxx11::string::~string((string *)&compAutoDepSet);
    cmsys::SystemTools::CopyFileIfDifferent(&this->Script,(string *)&compDepSet);
    std::__cxx11::string::string((string *)&compAutoDepSet,"Script",(allocator *)&path_3);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,(string *)&compAutoDepSet,&name);
    std::__cxx11::string::~string((string *)&compAutoDepSet);
    std::__cxx11::string::~string((string *)&compDepSet);
    std::__cxx11::string::~string((string *)&name);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&userInterfaces,&this->UserInterfaces);
  lVar5 = 0;
  uVar6 = 0;
  while( true ) {
    if ((ulong)((long)userInterfaces.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)userInterfaces.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar6) break;
    cmsys::SystemTools::GetFilenameName
              (&name,(string *)
                     ((long)&((userInterfaces.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5
                     ));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &compAutoDepSet,__lhs,"/meta/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&compDepSet,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &compAutoDepSet,&name);
    std::__cxx11::string::~string((string *)&compAutoDepSet);
    cmsys::SystemTools::CopyFileIfDifferent
              ((string *)
               ((long)&((userInterfaces.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&compDepSet);
    std::__cxx11::string::_M_assign
              ((string *)
               ((long)&((userInterfaces.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5));
    std::__cxx11::string::~string((string *)&compDepSet);
    std::__cxx11::string::~string((string *)&name);
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x20;
  }
  if (userInterfaces.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      userInterfaces.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&name,"UserInterfaces",(allocator *)&compDepSet);
    cmXMLWriter::StartElement(&xout,&name);
    std::__cxx11::string::~string((string *)&name);
    lVar5 = 0;
    for (uVar6 = 0;
        uVar6 < (ulong)((long)userInterfaces.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)userInterfaces.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar6 = uVar6 + 1) {
      std::__cxx11::string::string((string *)&name,"UserInterface",(allocator *)&compDepSet);
      cmXMLWriter::Element<std::__cxx11::string>
                (&xout,&name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&((userInterfaces.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5));
      std::__cxx11::string::~string((string *)&name);
      lVar5 = lVar5 + 0x20;
    }
    cmXMLWriter::EndElement(&xout);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&translations,&this->Translations);
  lVar5 = 0;
  uVar6 = 0;
  while( true ) {
    if ((ulong)((long)translations.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)translations.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar6) break;
    cmsys::SystemTools::GetFilenameName
              (&name,(string *)
                     ((long)&((translations.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5
                     ));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &compAutoDepSet,__lhs,"/meta/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&compDepSet,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &compAutoDepSet,&name);
    std::__cxx11::string::~string((string *)&compAutoDepSet);
    cmsys::SystemTools::CopyFileIfDifferent
              ((string *)
               ((long)&((translations.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&compDepSet);
    std::__cxx11::string::_M_assign
              ((string *)
               ((long)&((translations.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5));
    std::__cxx11::string::~string((string *)&compDepSet);
    std::__cxx11::string::~string((string *)&name);
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x20;
  }
  if (translations.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      translations.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&name,"Translations",(allocator *)&compDepSet);
    cmXMLWriter::StartElement(&xout,&name);
    std::__cxx11::string::~string((string *)&name);
    lVar5 = 0;
    for (uVar6 = 0;
        uVar6 < (ulong)((long)translations.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)translations.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar6 = uVar6 + 1) {
      std::__cxx11::string::string((string *)&name,"Translation",(allocator *)&compDepSet);
      cmXMLWriter::Element<std::__cxx11::string>
                (&xout,&name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&((translations.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5));
      std::__cxx11::string::~string((string *)&name);
      lVar5 = lVar5 + 0x20;
    }
    cmXMLWriter::EndElement(&xout);
  }
  p_Var1 = &compDepSet._M_t._M_impl.super__Rb_tree_header;
  compDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  compDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = (this->AlienDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  compDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  compDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  for (; (_Rb_tree_header *)p_Var3 != &(this->AlienDependencies)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::
    _Rb_tree<cmCPackIFWPackage::DependenceStruct,cmCPackIFWPackage::DependenceStruct,std::_Identity<cmCPackIFWPackage::DependenceStruct>,std::less<cmCPackIFWPackage::DependenceStruct>,std::allocator<cmCPackIFWPackage::DependenceStruct>>
    ::_M_insert_unique<cmCPackIFWPackage::DependenceStruct_const&>
              ((_Rb_tree<cmCPackIFWPackage::DependenceStruct,cmCPackIFWPackage::DependenceStruct,std::_Identity<cmCPackIFWPackage::DependenceStruct>,std::less<cmCPackIFWPackage::DependenceStruct>,std::allocator<cmCPackIFWPackage::DependenceStruct>>
                *)&compDepSet,*(DependenceStruct **)(p_Var3 + 1));
  }
  for (p_Var3 = (this->Dependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->Dependencies)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    DependenceStruct::DependenceStruct
              ((DependenceStruct *)&name,(string *)(*(long *)(p_Var3 + 1) + 0xa8));
    std::
    _Rb_tree<cmCPackIFWPackage::DependenceStruct,_cmCPackIFWPackage::DependenceStruct,_std::_Identity<cmCPackIFWPackage::DependenceStruct>,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
    ::_M_insert_unique<cmCPackIFWPackage::DependenceStruct>
              (&compDepSet._M_t,(DependenceStruct *)&name);
    DependenceStruct::~DependenceStruct((DependenceStruct *)&name);
  }
  if (compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
    p_Var3 = compDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    DependenceStruct::NameWithCompare_abi_cxx11_
              ((string *)&compAutoDepSet,
               (DependenceStruct *)
               (compDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1));
    std::operator<<((ostream *)&name,(string *)&compAutoDepSet);
    std::__cxx11::string::~string((string *)&compAutoDepSet);
    while( true ) {
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      if ((_Rb_tree_header *)p_Var3 == p_Var1) break;
      poVar4 = std::operator<<((ostream *)&name,",");
      DependenceStruct::NameWithCompare_abi_cxx11_
                ((string *)&compAutoDepSet,(DependenceStruct *)(p_Var3 + 1));
      std::operator<<(poVar4,(string *)&compAutoDepSet);
      std::__cxx11::string::~string((string *)&compAutoDepSet);
    }
    std::__cxx11::string::string((string *)&compAutoDepSet,"Dependencies",(allocator *)&local_298);
    std::__cxx11::stringbuf::str();
    cmXMLWriter::Element<std::__cxx11::string>(&xout,(string *)&compAutoDepSet,&path_3);
    std::__cxx11::string::~string((string *)&path_3);
    std::__cxx11::string::~string((string *)&compAutoDepSet);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
  }
  p_Var1 = &compAutoDepSet._M_t._M_impl.super__Rb_tree_header;
  compAutoDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  compAutoDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  compAutoDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = (this->AlienAutoDependOn)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  compAutoDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  compAutoDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  for (; (_Rb_tree_header *)p_Var3 != &(this->AlienAutoDependOn)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::
    _Rb_tree<cmCPackIFWPackage::DependenceStruct,cmCPackIFWPackage::DependenceStruct,std::_Identity<cmCPackIFWPackage::DependenceStruct>,std::less<cmCPackIFWPackage::DependenceStruct>,std::allocator<cmCPackIFWPackage::DependenceStruct>>
    ::_M_insert_unique<cmCPackIFWPackage::DependenceStruct_const&>
              ((_Rb_tree<cmCPackIFWPackage::DependenceStruct,cmCPackIFWPackage::DependenceStruct,std::_Identity<cmCPackIFWPackage::DependenceStruct>,std::less<cmCPackIFWPackage::DependenceStruct>,std::allocator<cmCPackIFWPackage::DependenceStruct>>
                *)&compAutoDepSet,*(DependenceStruct **)(p_Var3 + 1));
  }
  if (compAutoDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
    p_Var3 = compAutoDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    DependenceStruct::NameWithCompare_abi_cxx11_
              (&path_3,(DependenceStruct *)
                       (compAutoDepSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1));
    std::operator<<((ostream *)&name,(string *)&path_3);
    std::__cxx11::string::~string((string *)&path_3);
    while( true ) {
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      if ((_Rb_tree_header *)p_Var3 == p_Var1) break;
      poVar4 = std::operator<<((ostream *)&name,",");
      DependenceStruct::NameWithCompare_abi_cxx11_(&path_3,(DependenceStruct *)(p_Var3 + 1));
      std::operator<<(poVar4,(string *)&path_3);
      std::__cxx11::string::~string((string *)&path_3);
    }
    std::__cxx11::string::string((string *)&path_3,"AutoDependOn",(allocator *)&licenses);
    std::__cxx11::stringbuf::str();
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&path_3,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&path_3);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&licenses,&this->Licenses);
  uVar6 = 1;
  lVar5 = 0x20;
  while( true ) {
    if ((ulong)((long)licenses.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)licenses.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar6) break;
    cmsys::SystemTools::GetFilenameName
              (&name,(string *)
                     ((long)&((licenses.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5
                     ));
    std::operator+(&local_298,__lhs,"/meta/");
    std::operator+(&path_3,&local_298,&name);
    std::__cxx11::string::~string((string *)&local_298);
    cmsys::SystemTools::CopyFileIfDifferent
              ((string *)
               ((long)&((licenses.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5),
               &path_3);
    std::__cxx11::string::_M_assign
              ((string *)
               ((long)&((licenses.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5));
    std::__cxx11::string::~string((string *)&path_3);
    std::__cxx11::string::~string((string *)&name);
    uVar6 = uVar6 + 2;
    lVar5 = lVar5 + 0x40;
  }
  if (licenses.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      licenses.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&name,"Licenses",(allocator *)&path_3);
    cmXMLWriter::StartElement(&xout,&name);
    std::__cxx11::string::~string((string *)&name);
    lVar5 = 0;
    for (uVar6 = 0;
        uVar6 < (ulong)((long)licenses.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)licenses.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar6 = uVar6 + 2) {
      std::__cxx11::string::string((string *)&name,"License",(allocator *)&path_3);
      cmXMLWriter::StartElement(&xout,&name);
      std::__cxx11::string::~string((string *)&name);
      cmXMLWriter::Attribute<std::__cxx11::string>
                (&xout,"name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&((licenses.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5));
      cmXMLWriter::Attribute<std::__cxx11::string>
                (&xout,"file",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&licenses.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p + lVar5));
      cmXMLWriter::EndElement(&xout);
      lVar5 = lVar5 + 0x40;
    }
    cmXMLWriter::EndElement(&xout);
  }
  if ((this->ForcedInstallation)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&name,"ForcedInstallation",(allocator *)&path_3);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->ForcedInstallation);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->RequiresAdminRights)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&name,"RequiresAdminRights",(allocator *)&path_3);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->RequiresAdminRights);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->Virtual)._M_string_length == 0) {
    if ((this->Default)._M_string_length == 0) goto LAB_002dc0fe;
    std::__cxx11::string::string((string *)&name,"Default",(allocator *)&path_3);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->Default);
  }
  else {
    std::__cxx11::string::string((string *)&name,"Virtual",(allocator *)&path_3);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->Virtual);
  }
  std::__cxx11::string::~string((string *)&name);
LAB_002dc0fe:
  if ((this->Essential)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&name,"Essential",(allocator *)&path_3);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->Essential);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->SortingPriority)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&name,"SortingPriority",(allocator *)&path_3);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->SortingPriority);
    std::__cxx11::string::~string((string *)&name);
  }
  cmXMLWriter::EndElement(&xout);
  cmXMLWriter::EndDocument(&xout);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&licenses);
  std::
  _Rb_tree<cmCPackIFWPackage::DependenceStruct,_cmCPackIFWPackage::DependenceStruct,_std::_Identity<cmCPackIFWPackage::DependenceStruct>,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  ::~_Rb_tree(&compAutoDepSet._M_t);
  std::
  _Rb_tree<cmCPackIFWPackage::DependenceStruct,_cmCPackIFWPackage::DependenceStruct,_std::_Identity<cmCPackIFWPackage::DependenceStruct>,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  ::~_Rb_tree(&compDepSet._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&translations);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&userInterfaces);
  cmXMLWriter::~cmXMLWriter(&xout);
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  return;
}

Assistant:

void cmCPackIFWPackage::GeneratePackageFile()
{
  // Lazy directory initialization
  if (this->Directory.empty()) {
    if (this->Installer) {
      this->Directory = this->Installer->Directory + "/packages/" + this->Name;
    } else if (this->Generator) {
      this->Directory = this->Generator->toplevel + "/packages/" + this->Name;
    }
  }

  // Output stream
  cmGeneratedFileStream fout((this->Directory + "/meta/package.xml").data());
  cmXMLWriter xout(fout);

  xout.StartDocument();

  WriteGeneratedByToStrim(xout);

  xout.StartElement("Package");

  // DisplayName (with translations)
  for (std::map<std::string, std::string>::iterator it =
         this->DisplayName.begin();
       it != this->DisplayName.end(); ++it) {
    xout.StartElement("DisplayName");
    if (!it->first.empty()) {
      xout.Attribute("xml:lang", it->first);
    }
    xout.Content(it->second);
    xout.EndElement();
  }

  // Description (with translations)
  for (std::map<std::string, std::string>::iterator it =
         this->Description.begin();
       it != this->Description.end(); ++it) {
    xout.StartElement("Description");
    if (!it->first.empty()) {
      xout.Attribute("xml:lang", it->first);
    }
    xout.Content(it->second);
    xout.EndElement();
  }

  // Update text
  if (!this->UpdateText.empty()) {
    xout.Element("UpdateText", this->UpdateText);
  }

  xout.Element("Name", this->Name);
  xout.Element("Version", this->Version);

  if (!this->ReleaseDate.empty()) {
    xout.Element("ReleaseDate", this->ReleaseDate);
  } else {
    xout.Element("ReleaseDate", cmTimestamp().CurrentTime("%Y-%m-%d", true));
  }

  // Script (copy to meta dir)
  if (!this->Script.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->Script);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->Script, path);
    xout.Element("Script", name);
  }

  // User Interfaces (copy to meta dir)
  std::vector<std::string> userInterfaces = UserInterfaces;
  for (size_t i = 0; i < userInterfaces.size(); i++) {
    std::string name = cmSystemTools::GetFilenameName(userInterfaces[i]);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(userInterfaces[i], path);
    userInterfaces[i] = name;
  }
  if (!userInterfaces.empty()) {
    xout.StartElement("UserInterfaces");
    for (size_t i = 0; i < userInterfaces.size(); i++) {
      xout.Element("UserInterface", userInterfaces[i]);
    }
    xout.EndElement();
  }

  // Translations (copy to meta dir)
  std::vector<std::string> translations = Translations;
  for (size_t i = 0; i < translations.size(); i++) {
    std::string name = cmSystemTools::GetFilenameName(translations[i]);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(translations[i], path);
    translations[i] = name;
  }
  if (!translations.empty()) {
    xout.StartElement("Translations");
    for (size_t i = 0; i < translations.size(); i++) {
      xout.Element("Translation", translations[i]);
    }
    xout.EndElement();
  }

  // Dependencies
  std::set<DependenceStruct> compDepSet;
  for (std::set<DependenceStruct*>::iterator ait =
         this->AlienDependencies.begin();
       ait != this->AlienDependencies.end(); ++ait) {
    compDepSet.insert(*(*ait));
  }
  for (std::set<cmCPackIFWPackage*>::iterator it = this->Dependencies.begin();
       it != this->Dependencies.end(); ++it) {
    compDepSet.insert(DependenceStruct((*it)->Name));
  }
  // Write dependencies
  if (!compDepSet.empty()) {
    std::ostringstream dependencies;
    std::set<DependenceStruct>::iterator it = compDepSet.begin();
    dependencies << it->NameWithCompare();
    ++it;
    while (it != compDepSet.end()) {
      dependencies << "," << it->NameWithCompare();
      ++it;
    }
    xout.Element("Dependencies", dependencies.str());
  }

  // Automatic dependency on
  std::set<DependenceStruct> compAutoDepSet;
  for (std::set<DependenceStruct*>::iterator ait =
         this->AlienAutoDependOn.begin();
       ait != this->AlienAutoDependOn.end(); ++ait) {
    compAutoDepSet.insert(*(*ait));
  }
  // Write automatic dependency on
  if (!compAutoDepSet.empty()) {
    std::ostringstream dependencies;
    std::set<DependenceStruct>::iterator it = compAutoDepSet.begin();
    dependencies << it->NameWithCompare();
    ++it;
    while (it != compAutoDepSet.end()) {
      dependencies << "," << it->NameWithCompare();
      ++it;
    }
    xout.Element("AutoDependOn", dependencies.str());
  }

  // Licenses (copy to meta dir)
  std::vector<std::string> licenses = this->Licenses;
  for (size_t i = 1; i < licenses.size(); i += 2) {
    std::string name = cmSystemTools::GetFilenameName(licenses[i]);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(licenses[i], path);
    licenses[i] = name;
  }
  if (!licenses.empty()) {
    xout.StartElement("Licenses");
    for (size_t i = 0; i < licenses.size(); i += 2) {
      xout.StartElement("License");
      xout.Attribute("name", licenses[i]);
      xout.Attribute("file", licenses[i + 1]);
      xout.EndElement();
    }
    xout.EndElement();
  }

  if (!this->ForcedInstallation.empty()) {
    xout.Element("ForcedInstallation", this->ForcedInstallation);
  }

  if (!this->RequiresAdminRights.empty()) {
    xout.Element("RequiresAdminRights", this->RequiresAdminRights);
  }

  if (!this->Virtual.empty()) {
    xout.Element("Virtual", this->Virtual);
  } else if (!this->Default.empty()) {
    xout.Element("Default", this->Default);
  }

  // Essential
  if (!this->Essential.empty()) {
    xout.Element("Essential", this->Essential);
  }

  // Priority
  if (!this->SortingPriority.empty()) {
    xout.Element("SortingPriority", this->SortingPriority);
  }

  xout.EndElement();
  xout.EndDocument();
}